

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::genFilters
          (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           *__return_storage_ptr__,FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
          *messages,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *initial,deUint32 seed,int iterations)

{
  _Rb_tree_color _Var1;
  GLenum GVar2;
  GLenum GVar3;
  void *pvVar4;
  deUint32 dVar5;
  deBool dVar6;
  pointer pMVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 *puVar9;
  ulong uVar10;
  long lVar11;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *pvVar12;
  uint uVar13;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  bool bVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> severities;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  tempMessageIds;
  Random rng;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSeverities;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempTypes;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSources;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  value_type local_1b0;
  undefined8 *local_180;
  ulong local_178;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *local_170;
  uint local_164;
  ulong local_160;
  void *local_158;
  long local_150;
  long local_148;
  void *local_140;
  long local_138;
  long local_130;
  void *local_128;
  long local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  _Rb_tree_node_base local_f8;
  long local_d8;
  deRandom local_d0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_90;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  dVar5 = deStringHash((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  uVar13 = (dVar5 >> 0x10 ^ dVar5 ^ 0x3d) * 9;
  uVar13 = (uVar13 >> 4 ^ uVar13) * 0x27d4eb2d;
  deRandom_init(&local_d0,uVar13 >> 0xf ^ seed ^ uVar13);
  local_f8._M_left = &local_f8;
  local_f8._M_color = _S_red;
  local_f8._M_parent = (_Rb_tree_node_base *)0x0;
  local_d8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8._M_right = local_f8._M_left;
  if ((messages->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (messages->
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,initial);
  }
  else {
    pMVar7 = (messages->
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_170 = initial;
    if (0 < (int)((ulong)((long)(messages->
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) >> 4) *
            -0x55555555) {
      lVar11 = 0;
      do {
        pMVar7 = pMVar7 + lVar11;
        p_Var16 = local_f8._M_parent;
        if (local_f8._M_parent == (_Rb_tree_node_base *)0x0) {
          bVar17 = true;
          p_Var15 = &local_f8;
        }
        else {
          _Var1 = (pMVar7->id).source;
          uVar13 = (pMVar7->id).type;
          do {
            p_Var15 = p_Var16;
            bVar17 = true;
            if (p_Var15[1]._M_color <= _Var1) {
              if (_Var1 == p_Var15[1]._M_color) {
                if (*(uint *)&p_Var15[1].field_0x4 <= uVar13) {
                  if (uVar13 != *(uint *)&p_Var15[1].field_0x4) goto LAB_013d5ed3;
                  bVar17 = (pMVar7->id).id < *(uint *)&p_Var15[1]._M_parent;
                }
              }
              else {
LAB_013d5ed3:
                bVar17 = false;
              }
            }
            p_Var16 = (&p_Var15->_M_left)[bVar17 ^ 1];
          } while (p_Var16 != (_Base_ptr)0x0);
        }
        p_Var8 = p_Var15;
        if (bVar17 == false) {
LAB_013d5f10:
          _Var1 = (pMVar7->id).source;
          bVar17 = true;
          if (_Var1 <= p_Var8[1]._M_color) {
            if (p_Var8[1]._M_color == _Var1) {
              uVar13 = (pMVar7->id).type;
              if (uVar13 <= *(uint *)&p_Var8[1].field_0x4) {
                if (*(uint *)&p_Var8[1].field_0x4 != uVar13) goto LAB_013d5f3a;
                bVar17 = *(uint *)&p_Var8[1]._M_parent < (pMVar7->id).id;
              }
            }
            else {
LAB_013d5f3a:
              bVar17 = false;
            }
          }
          if (!bVar17) {
            p_Var15 = (_Rb_tree_node_base *)0x0;
            p_Var16 = p_Var8;
          }
        }
        else if (p_Var15 != local_f8._M_left) {
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var15);
          goto LAB_013d5f10;
        }
        if (p_Var15 != (_Rb_tree_node_base *)0x0) {
          bVar17 = true;
          if (((p_Var16 == (_Rb_tree_node_base *)0x0) && (&local_f8 != p_Var15)) &&
             (_Var1 = (pMVar7->id).source, p_Var15[1]._M_color <= _Var1)) {
            if (_Var1 == p_Var15[1]._M_color) {
              uVar13 = (pMVar7->id).type;
              if (*(uint *)&p_Var15[1].field_0x4 <= uVar13) {
                if (uVar13 != *(uint *)&p_Var15[1].field_0x4) goto LAB_013d5f91;
                bVar17 = (pMVar7->id).id < *(uint *)&p_Var15[1]._M_parent;
              }
            }
            else {
LAB_013d5f91:
              bVar17 = false;
            }
          }
          p_Var8 = (_Rb_tree_node_base *)operator_new(0x30);
          *(GLuint *)&p_Var8[1]._M_parent = (pMVar7->id).id;
          GVar2 = (pMVar7->id).type;
          p_Var8[1]._M_color = (pMVar7->id).source;
          *(GLenum *)&p_Var8[1].field_0x4 = GVar2;
          std::_Rb_tree_insert_and_rebalance(bVar17,p_Var8,p_Var15,&local_f8);
          local_d8 = local_d8 + 1;
        }
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_60,(uint *)pMVar7);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_90,&(pMVar7->id).type);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)&local_c0,&pMVar7->severity);
        lVar11 = lVar11 + 1;
        pMVar7 = (messages->
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar11 < (int)((ulong)((long)(messages->
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar7) >> 4) * -0x55555555);
    }
    p_Var15 = local_f8._M_left;
    uVar10 = 0;
    p_Var8 = local_f8._M_left;
    while (p_Var8 != &local_f8) {
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      uVar10 = uVar10 + 1;
    }
    if (0xaaaaaaaaaaaaaaa < uVar10) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    local_178 = uVar10;
    if (uVar10 == 0) {
      puVar9 = (undefined8 *)0x0;
      local_180 = puVar9;
    }
    else {
      puVar9 = (undefined8 *)operator_new(uVar10 * 0xc);
      local_180 = puVar9;
    }
    while (p_Var15 != &local_f8) {
      *(undefined4 *)(puVar9 + 1) = *(undefined4 *)&p_Var15[1]._M_parent;
      *puVar9 = *(undefined8 *)(p_Var15 + 1);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
      puVar9 = (undefined8 *)((long)puVar9 + 0xc);
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_158,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_60._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_60._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b0);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_128,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_90._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_90._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b0);
    pvVar12 = local_170;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_140,
               (_Rb_tree_const_iterator<unsigned_int>)
               local_c0._M_impl.super__Rb_tree_header._M_header._M_left,
               (_Rb_tree_const_iterator<unsigned_int>)&local_c0._M_impl.super__Rb_tree_header,
               (allocator_type *)&local_1b0);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,pvVar12);
    local_110 = ((long)puVar9 - (long)local_180 >> 2) * -0x5555555555555555;
    local_164 = (int)local_110 + 1;
    local_160 = 0;
    do {
      dVar5 = deRandom_getUint32(&local_d0);
      lVar11 = local_150;
      pvVar4 = local_158;
      uVar13 = dVar5 % 9;
      if (uVar13 == 0) {
        dVar5 = deRandom_getUint32(&local_d0);
        GVar2 = *(GLenum *)
                 ((long)local_158 +
                 (long)(int)((ulong)dVar5 % ((ulong)(lVar11 - (long)pvVar4) >> 2 & 0xffffffff)) * 4)
        ;
        dVar6 = deRandom_getBool(&local_d0);
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1b0.type = 0x1100;
        local_1b0.severity = 0x1100;
        local_1b0.source = GVar2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1b0.ids,&local_1c8);
        local_1b0.enabled = dVar6 == 1;
        initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                   *)&local_1b0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,(value_type *)initial);
LAB_013d633e:
        if (local_1b0.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)((long)local_1b0.ids.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_1b0.ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
          operator_delete(local_1b0.ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)initial);
        }
        if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)((long)local_1c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_1c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
          operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,(ulong)initial);
        }
      }
      else {
        if (uVar13 == 1) {
          dVar5 = deRandom_getUint32(&local_d0);
          GVar2 = *(GLenum *)
                   ((long)local_128 + ((ulong)dVar5 % (ulong)(local_120 - (long)local_128 >> 2)) * 4
                   );
          dVar6 = deRandom_getBool(&local_d0);
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b0.source = 0x1100;
          local_1b0.severity = 0x1100;
          local_1b0.type = GVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b0.ids,&local_1c8);
          local_1b0.enabled = dVar6 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          goto LAB_013d633e;
        }
        if (uVar13 == 2) {
          dVar5 = deRandom_getUint32(&local_d0);
          GVar2 = *(GLenum *)
                   ((long)local_140 + ((ulong)dVar5 % (ulong)(local_138 - (long)local_140 >> 2)) * 4
                   );
          dVar6 = deRandom_getBool(&local_d0);
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1b0.source = 0x1100;
          local_1b0.type = 0x1100;
          local_1b0.severity = GVar2;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b0.ids,&local_1c8);
          local_1b0.enabled = dVar6 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          goto LAB_013d633e;
        }
        dVar5 = deRandom_getUint32(&local_d0);
        local_108 = (ulong)dVar5 % (ulong)local_164;
        pvVar12 = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                   *)&DAT_00000004;
        iVar14 = 0;
        do {
          dVar6 = deRandom_getBool(&local_d0);
          puVar9 = local_180;
          uVar10 = (ulong)(long)((int)local_108 + iVar14) % local_110;
          GVar2 = *(GLenum *)((long)local_180 + uVar10 * 0xc);
          GVar3 = *(GLenum *)((long)local_180 + uVar10 * 0xc + 4);
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_170 = pvVar12;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(4);
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          *local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = *(uint *)((long)puVar9 + uVar10 * 0xc + 8);
          local_1b0.severity = 0x1100;
          local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1b0.source = GVar2;
          local_1b0.type = GVar3;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_1b0.ids,&local_1c8);
          local_1b0.enabled = dVar6 == 1;
          initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)&local_1b0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,(value_type *)initial);
          if (local_1b0.ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       *)((long)local_1b0.ids.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_1b0.ids.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_1b0.ids.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)initial);
          }
          pvVar12 = local_170;
          if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                       *)((long)local_1c8.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_1c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)initial);
          }
          iVar14 = iVar14 + 1;
          pvVar12 = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                     *)((long)&pvVar12[-1].
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        } while (pvVar12 !=
                 (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                  *)0x0);
      }
      uVar13 = (int)local_160 + 1;
      local_160 = (ulong)uVar13;
    } while (uVar13 != 4);
    if (local_140 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_130 - (long)local_140);
      operator_delete(local_140,(ulong)initial);
    }
    puVar9 = local_180;
    if (local_128 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_118 - (long)local_128);
      operator_delete(local_128,(ulong)initial);
    }
    if (local_158 != (void *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_148 - (long)local_158);
      operator_delete(local_158,(ulong)initial);
    }
    if (puVar9 != (undefined8 *)0x0) {
      initial = (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                 *)(local_178 * 0xc);
      operator_delete(puVar9,(ulong)initial);
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::_Identity<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  ::_M_erase((_Rb_tree<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::_Identity<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
              *)local_f8._M_parent,(_Link_type)initial);
  return __return_storage_ptr__;
}

Assistant:

vector<FilterCase::MessageFilter> FilterCase::genFilters (const vector<MessageData>& messages, const vector<MessageFilter>& initial, deUint32 seed, int iterations) const
{
	de::Random				rng				(seed ^ deInt32Hash(deStringHash(getName())));

	set<MessageID>			tempMessageIds;
	set<GLenum>				tempSources;
	set<GLenum>				tempTypes;
	set<GLenum>				tempSeverities;

	if (messages.empty())
		return initial;

	for (int ndx = 0; ndx < int(messages.size()); ndx++)
	{
		const MessageData& msg = messages[ndx];

		tempMessageIds.insert(msg.id);
		tempSources.insert(msg.id.source);
		tempTypes.insert(msg.id.type);
		tempSeverities.insert(msg.severity);
	}

	{
		// Fetchable by index
		const vector<MessageID> messageIds	(tempMessageIds.begin(), tempMessageIds.end());
		const vector<GLenum>	sources		(tempSources.begin(), tempSources.end());
		const vector<GLenum>	types		(tempTypes.begin(), tempTypes.end());
		const vector<GLenum>	severities	(tempSeverities.begin(), tempSeverities.end());

		vector<MessageFilter>	filters		= initial;

		for (int iteration = 0; iteration < iterations; iteration++)
		{
			switch(rng.getInt(0, 8)) // Distribute so that per-message randomization (the default branch) is prevalent
			{
				case 0:
				{
					const GLenum	source	= sources[rng.getInt(0, int(sources.size()-1))];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(source, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 1:
				{
					const GLenum	type	= types[rng.getUint32()%types.size()];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, type, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 2:
				{
					const GLenum	severity	= severities[rng.getUint32()%severities.size()];
					const bool		enabled		= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, GL_DONT_CARE, severity, vector<GLuint>(), enabled));
					break;
				}

				default:
				{
					const int start = rng.getInt(0, int(messageIds.size()));

					for (int itr = 0; itr < 4; itr++)
					{
						const MessageID&	id		= messageIds[(start+itr)%messageIds.size()];
						const bool			enabled = rng.getBool();

						filters.push_back(MessageFilter(id.source, id.type, GL_DONT_CARE, vector<GLuint>(1, id.id), enabled));
					}
				}
			}
		}

		return filters;
	}
}